

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetectorTest.cpp
# Opt level: O0

void __thiscall
TEST_SimpleStringBuffer_setWriteLimitTooHighIsIgnored_Test::
~TEST_SimpleStringBuffer_setWriteLimitTooHighIsIgnored_Test
          (TEST_SimpleStringBuffer_setWriteLimitTooHighIsIgnored_Test *this)

{
  TEST_SimpleStringBuffer_setWriteLimitTooHighIsIgnored_Test *this_local;
  
  ~TEST_SimpleStringBuffer_setWriteLimitTooHighIsIgnored_Test(this);
  operator_delete(this,8);
  return;
}

Assistant:

TEST(SimpleStringBuffer, setWriteLimitTooHighIsIgnored)
{
    SimpleStringBuffer buffer;
    buffer.setWriteLimit(SimpleStringBuffer::SIMPLE_STRING_BUFFER_LEN+10);
    for (int i = 0; i < SimpleStringBuffer::SIMPLE_STRING_BUFFER_LEN+10; i++)
        buffer.add("h");
    SimpleString str("h", SimpleStringBuffer::SIMPLE_STRING_BUFFER_LEN-1);
    STRCMP_EQUAL(str.asCharString(), buffer.toString());
}